

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti.c
# Opt level: O0

int main(int argc,char **argv)

{
  mdl_t *pmVar1;
  mdl_t *mdl;
  opt_t opt;
  rdr_t *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  opt_t *in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  mdl_t *in_stack_ffffffffffffff70;
  mdl_t *in_stack_ffffffffffffff90;
  
  memcpy((opt_t *)&stack0xffffffffffffff00,&opt_defaults,0xf0);
  opt_parse(in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  rdr_new(SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
  pmVar1 = mdl_new(in_stack_fffffffffffffef0);
  pmVar1->opt = (opt_t *)&stack0xffffffffffffff00;
  switch(in_stack_ffffffffffffff00) {
  case 0:
    dotrain((mdl_t *)in_stack_ffffffffffffff20);
    break;
  case 1:
    dolabel((mdl_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    break;
  case 2:
    dodump(in_stack_ffffffffffffff70);
    break;
  case 3:
    doupdt(in_stack_ffffffffffffff90);
  }
  mdl_free((mdl_t *)0x117f85);
  return 0;
}

Assistant:

int main(int argc, char *argv[argc]) {
	// We first parse command line switchs
	opt_t opt = opt_defaults;
	opt_parse(argc, argv, &opt);
	// Next we prepare the model
	mdl_t *mdl = mdl_new(rdr_new(opt.maxent));
	mdl->opt = &opt;
	// And switch to requested mode
	switch (opt.mode) {
		case 0: dotrain(mdl); break;
		case 1: dolabel(mdl); break;
		case 2: dodump(mdl);  break;
		case 3: doupdt(mdl);  break;
	}
	// And cleanup
	mdl_free(mdl);
	return EXIT_SUCCESS;
}